

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

void __thiscall MADPComponentFactoredStates::PrintDebugStuff(MADPComponentFactoredStates *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  stringstream ss;
  long *local_380;
  long local_378;
  long local_370 [2];
  long *local_360;
  long local_358;
  long local_350 [2];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------------------",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MADPComponentFactoredStates::SetInitialized(true) run",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*this* (at mem address",0x16);
  poVar2 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") has ",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"_m_initialized=",0xf);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"_m_nrStates=",0xc);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_m_nrStateFactors=",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"_m_sfacDomainSizes=",0x13);
  std::__cxx11::stringstream::stringstream(local_340);
  puVar3 = (this->_m_sfacDomainSizes).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->_m_sfacDomainSizes).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>(local_330,"< ",2);
  if (puVar3 != puVar1) {
    do {
      if (puVar3 != (this->_m_sfacDomainSizes).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(local_330,", ",2);
      }
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      std::__ostream_insert<char,std::char_traits<char>>(local_330,(char *)local_380,local_378);
      if (local_380 != local_370) {
        operator_delete(local_380,local_370[0] + 1);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_330," >",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_360,local_358);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_360 != local_350) {
    operator_delete(local_360,local_350[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------------------------------",0x35);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void MADPComponentFactoredStates::PrintDebugStuff() const
{
    cout << "-----------------------------------------------------"<<endl;
    cout << "MADPComponentFactoredStates::SetInitialized(true) run"<<endl;
    cout << "*this* (at mem address"<<this<<") has "<<endl;
    cout << "_m_initialized="<<_m_initialized<<endl;
    cout << "_m_nrStates="<<_m_nrStates<<endl;
    cout << "_m_nrStateFactors="<<_m_nrStateFactors<<endl;
    cout << "_m_sfacDomainSizes="<<SoftPrintVector(_m_sfacDomainSizes)<<
        endl;
    cout << "-----------------------------------------------------"<<endl;
}